

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::PlainGatherUnormCubeArray::Supported(PlainGatherUnormCubeArray *this)

{
  bool bVar1;
  string local_40;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
                     m_context)->m_contextInfo,"GL_ARB_texture_cube_map_array");
  if (!bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_ARB_texture_cube_map_array not supported","");
    deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

virtual bool Supported()
	{
		if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_cube_map_array"))
		{
			OutputNotSupported("GL_ARB_texture_cube_map_array not supported");
			return false;
		}
		return true;
	}